

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O2

void __thiscall cmDepends::SetIncludePathFromLanguage(cmDepends *this,string *lang)

{
  cmMakefile *this_00;
  char *pcVar1;
  string includePathVar;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_",(allocator *)&local_58);
  std::__cxx11::string::append((string *)&local_38);
  std::__cxx11::string::append((char *)&local_38);
  this_00 = this->LocalGenerator->Makefile;
  pcVar1 = cmMakefile::GetDefinition(this_00,&local_38);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_38);
    std::__cxx11::string::append((string *)&local_38);
    std::__cxx11::string::append((char *)&local_38);
    pcVar1 = cmMakefile::GetDefinition(this_00,&local_38);
    if (pcVar1 == (char *)0x0) goto LAB_00449d89;
    std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
    cmSystemTools::ExpandListArgument(&local_58,&this->IncludePath,false);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
    cmSystemTools::ExpandListArgument(&local_58,&this->IncludePath,false);
  }
  std::__cxx11::string::~string((string *)&local_58);
LAB_00449d89:
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void cmDepends::SetIncludePathFromLanguage(const std::string& lang)
{
  // Look for the new per "TARGET_" variant first:
  const char* includePath = CM_NULLPTR;
  std::string includePathVar = "CMAKE_";
  includePathVar += lang;
  includePathVar += "_TARGET_INCLUDE_PATH";
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  includePath = mf->GetDefinition(includePathVar);
  if (includePath) {
    cmSystemTools::ExpandListArgument(includePath, this->IncludePath);
  } else {
    // Fallback to the old directory level variable if no per-target var:
    includePathVar = "CMAKE_";
    includePathVar += lang;
    includePathVar += "_INCLUDE_PATH";
    includePath = mf->GetDefinition(includePathVar);
    if (includePath) {
      cmSystemTools::ExpandListArgument(includePath, this->IncludePath);
    }
  }
}